

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void __thiscall
pdqsort_detail::
sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
          (pdqsort_detail *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> a,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> c,
          anon_class_16_2_fd512ddf comp)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int __tmp;
  int iVar6;
  ulong uVar7;
  long lVar8;
  HighsCutGeneration *pHVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  
  pHVar9 = comp.this;
  iVar6 = *a._M_current;
  iVar5 = *(int *)this;
  lVar8 = (long)iVar6;
  lVar12 = *(long *)(c._M_current + 0x14);
  dVar2 = *(double *)(lVar12 + lVar8 * 8);
  lVar11 = (long)iVar5;
  if ((1.5 <= dVar2) || (*(double *)(lVar12 + lVar11 * 8) <= 1.5)) {
    if ((dVar2 <= 1.5) ||
       (pdVar1 = (double *)(lVar12 + lVar11 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
      dVar2 = *(double *)(*(long *)(c._M_current + 0x30) + lVar8 * 8);
      dVar15 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar8 * 8) * dVar2;
      dVar3 = *(double *)(*(long *)(c._M_current + 0x30) + lVar11 * 8);
      dVar16 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar11 * 8) * dVar3;
      dVar4 = *(double *)(c._M_current + 0x2c);
      if (dVar16 + dVar4 < dVar15) goto LAB_00282729;
      if (dVar16 - dVar4 <= dVar15) {
        if (ABS(dVar2 - dVar3) <= dVar4) {
          uVar10 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar8 * 4);
          lVar14 = (ulong)*(uint *)&pHVar9->lpRelaxation + 0x8a183895eeac1536;
          lVar13 = (ulong)*(uint *)&pHVar9->lpRelaxation + 0x80c8963be3e4c2f3;
          uVar7 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar11 * 4);
          if (((uVar7 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^ (uVar7 + 0x42d8680e260ae5b) * lVar14)
              < ((uVar10 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                (uVar10 + 0x42d8680e260ae5b) * lVar14)) goto LAB_00282729;
        }
        else if (dVar3 < dVar2) goto LAB_00282729;
      }
    }
  }
  else {
LAB_00282729:
    *(int *)this = iVar6;
    *a._M_current = iVar5;
    lVar8 = lVar11;
    iVar6 = iVar5;
  }
  lVar11 = (long)*b._M_current;
  dVar2 = *(double *)(lVar12 + lVar11 * 8);
  if ((1.5 <= dVar2) || (*(double *)(lVar12 + lVar8 * 8) <= 1.5)) {
    if ((1.5 < dVar2) && (pdVar1 = (double *)(lVar12 + lVar8 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5)
       ) goto LAB_002827c4;
    dVar2 = *(double *)(*(long *)(c._M_current + 0x30) + lVar11 * 8);
    dVar15 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar11 * 8) * dVar2;
    dVar3 = *(double *)(*(long *)(c._M_current + 0x30) + lVar8 * 8);
    dVar16 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar8 * 8) * dVar3;
    dVar4 = *(double *)(c._M_current + 0x2c);
    if (dVar15 <= dVar16 + dVar4) {
      if (dVar15 < dVar16 - dVar4) goto LAB_002827c4;
      if (ABS(dVar2 - dVar3) <= dVar4) {
        uVar7 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar11 * 4);
        lVar11 = (ulong)*(uint *)&pHVar9->lpRelaxation + 0x8a183895eeac1536;
        lVar14 = (ulong)*(uint *)&pHVar9->lpRelaxation + 0x80c8963be3e4c2f3;
        uVar10 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar8 * 4);
        if (((uVar7 + 0xc8497d2a400d9551) * lVar14 >> 0x20 ^ (uVar7 + 0x42d8680e260ae5b) * lVar11)
            <= ((uVar10 + 0xc8497d2a400d9551) * lVar14 >> 0x20 ^
               (uVar10 + 0x42d8680e260ae5b) * lVar11)) goto LAB_002827c4;
      }
      else if (dVar2 <= dVar3) goto LAB_002827c4;
    }
  }
  *a._M_current = *b._M_current;
  *b._M_current = iVar6;
  iVar6 = *a._M_current;
LAB_002827c4:
  iVar5 = *(int *)this;
  lVar11 = (long)iVar6;
  dVar2 = *(double *)(lVar12 + lVar11 * 8);
  lVar8 = (long)iVar5;
  if ((1.5 <= dVar2) || (*(double *)(lVar12 + lVar8 * 8) <= 1.5)) {
    if ((1.5 < dVar2) && (pdVar1 = (double *)(lVar12 + lVar8 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5)
       ) {
      return;
    }
    dVar2 = *(double *)(*(long *)(c._M_current + 0x30) + lVar11 * 8);
    dVar15 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar11 * 8) * dVar2;
    dVar3 = *(double *)(*(long *)(c._M_current + 0x30) + lVar8 * 8);
    dVar16 = *(double *)(*(long *)(c._M_current + 0x1a) + lVar8 * 8) * dVar3;
    dVar4 = *(double *)(c._M_current + 0x2c);
    if (dVar15 <= dVar16 + dVar4) {
      if (dVar15 < dVar16 - dVar4) {
        return;
      }
      if (ABS(dVar2 - dVar3) <= dVar4) {
        uVar7 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar11 * 4);
        lVar11 = (ulong)*(uint *)&pHVar9->lpRelaxation + 0x8a183895eeac1536;
        lVar12 = (ulong)*(uint *)&pHVar9->lpRelaxation + 0x80c8963be3e4c2f3;
        uVar10 = (ulong)*(uint *)(*(long *)(c._M_current + 0x32) + lVar8 * 4);
        if (((uVar7 + 0xc8497d2a400d9551) * lVar12 >> 0x20 ^ (uVar7 + 0x42d8680e260ae5b) * lVar11)
            <= ((uVar10 + 0xc8497d2a400d9551) * lVar12 >> 0x20 ^
               (uVar10 + 0x42d8680e260ae5b) * lVar11)) {
          return;
        }
      }
      else if (dVar2 <= dVar3) {
        return;
      }
    }
  }
  *(int *)this = iVar6;
  *a._M_current = iVar5;
  return;
}

Assistant:

inline void sort2(Iter a, Iter b, Compare comp) {
        if (comp(*b, *a)) std::iter_swap(a, b);
    }